

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::composeExtentStartPoint(CLPIParser *this,BitStreamWriter *writer)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  int *piVar7;
  uint32_t uVar8;
  int *i;
  int *piVar9;
  uint value;
  int local_58;
  
  puVar3 = (writer->super_BitStream).m_buffer;
  puVar4 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  value = 0;
  BitStreamWriter::putBits(writer,0x20,0);
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  BitStreamWriter::putBits
            (writer,0x10,
             (uint)((ulong)((long)(this->interleaveInfo).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->interleaveInfo).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2));
  piVar7 = (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar9 = (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar7; piVar9 = piVar9 + 1) {
    value = value + *piVar9;
    BitStreamWriter::putBits(writer,0x20,value);
  }
  local_58 = (int)puVar6;
  uVar8 = my_ntohl((int)(uVar2 + ((int)puVar5 - local_58) * 8) / -8 +
                   (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8);
  *(uint32_t *)((long)puVar4 + (long)((int)(uVar1 + ((int)puVar3 - (int)puVar4) * 8) / 8)) = uVar8;
  return;
}

Assistant:

void CLPIParser::composeExtentStartPoint(BitStreamWriter& writer) const
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(16, 0);  // reserved
    writer.putBits(16, static_cast<unsigned>(interleaveInfo.size()));

    uint32_t sum = 0;
    for (const auto& i : interleaveInfo)
    {
        sum += i;
        writer.putBits(32, sum);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}